

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

uint AddString(TidyPrintImpl *pprint,ctmbstr str)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint len;
  
  uVar1 = pprint->linelen;
  uVar2 = prvTidytmbstrlen(str);
  len = uVar2 + uVar1;
  if (pprint->lbufsize <= len) {
    expand(pprint,len);
  }
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pprint->linebuf[uVar1 + (int)uVar3] = (int)str[uVar3];
  }
  pprint->linelen = len;
  return uVar2;
}

Assistant:

static uint AddString( TidyPrintImpl* pprint, ctmbstr str )
{
   return pprint->linelen = AddAsciiString( pprint, str, pprint->linelen );
}